

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O0

string_t duckdb::NumericHelper::FormatSigned<unsigned_short>(unsigned_short value,Vector *vector)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  string_t *this;
  char *pcVar4;
  ushort in_DI;
  anon_union_16_2_67f50693_for_value aVar5;
  char *endptr;
  char *dataptr;
  unsigned_long length;
  unsigned_t unsigned_value;
  int8_t sign;
  string_t result;
  Vector *in_stack_ffffffffffffffc0;
  
  uVar2 = (uint)in_DI;
  cVar1 = AbsValue<signed_char>('\0');
  iVar3 = UnsignedLength<unsigned_short>((short)uVar2 + (short)cVar1);
  cVar1 = AbsValue<signed_char>('\0');
  this = (string_t *)UnsafeNumericCast<unsigned_long,int,void>(iVar3 + cVar1);
  aVar5.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString(in_stack_ffffffffffffffc0,CONCAT44(iVar3,uVar2));
  pcVar4 = string_t::GetDataWriteable((string_t *)in_stack_ffffffffffffffc0);
  FormatUnsigned<unsigned_short>((unsigned_short)((ulong)pcVar4 >> 0x30),pcVar4 + (long)this);
  string_t::Finalize(this);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar5.pointer;
}

Assistant:

static string_t FormatSigned(T value, Vector &vector) {
		typedef typename MakeUnsigned<T>::type unsigned_t;
		int8_t sign = -(value < 0);
		unsigned_t unsigned_value = unsigned_t(value ^ T(sign)) + unsigned_t(AbsValue(sign));
		auto length = UnsafeNumericCast<idx_t>(UnsignedLength<unsigned_t>(unsigned_value) + AbsValue(sign));
		string_t result = StringVector::EmptyString(vector, length);
		auto dataptr = result.GetDataWriteable();
		auto endptr = dataptr + length;
		endptr = FormatUnsigned(unsigned_value, endptr);
		if (sign) {
			*--endptr = '-';
		}
		result.Finalize();
		return result;
	}